

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCurrentTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1122e::TestCanSetAndGetResults::~TestCanSetAndGetResults
          (TestCanSetAndGetResults *this)

{
  TestCanSetAndGetResults *this_local;
  
  ~TestCanSetAndGetResults(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CanSetAndGetResults)
{
	bool ok = false;
	{
		ScopedCurrentTest scopedTest;

		UnitTest::TestResults results;
		UnitTest::CurrentTest::Results() = &results;

		ok = (UnitTest::CurrentTest::Results() == &results);
	}

	CHECK(ok);
}